

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1ac67::
ARTCorrectnessTest_DbInsertNodeRecursion_Test<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::TestBody(ARTCorrectnessTest_DbInsertNodeRecursion_Test<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  size_t sVar1;
  initializer_list<int> absent_keys;
  value_view v;
  value_view v_00;
  value_view v_01;
  value_view v_02;
  const_reference pvVar2;
  inode_type_counter_array local_1f8;
  node_type_counter_array local_1d8;
  int local_1a4 [3];
  iterator local_198;
  undefined8 local_190;
  pointer local_188;
  undefined7 uStackY_180;
  bool in_stack_fffffffffffffe87;
  tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffe88;
  undefined1 local_118 [8];
  tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  verifier;
  ARTCorrectnessTest_DbInsertNodeRecursion_Test<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *this_local;
  
  verifier.key_views.
  super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  unodb::test::
  tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::tree_verifier(in_stack_fffffffffffffe88,in_stack_fffffffffffffe87);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,0);
  v_00._M_ptr = pvVar2->_M_ptr;
  v_00._M_extent._M_extent_value = (pvVar2->_M_extent)._M_extent_value;
  unodb::test::
  tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert<int>((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                 *)local_118,1,v_00,false);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,2);
  v_01._M_ptr = pvVar2->_M_ptr;
  v_01._M_extent._M_extent_value = (pvVar2->_M_extent)._M_extent_value;
  unodb::test::
  tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert<int>((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                 *)local_118,3,v_01,false);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,3);
  v_02._M_ptr = pvVar2->_M_ptr;
  v_02._M_extent._M_extent_value = (pvVar2->_M_extent)._M_extent_value;
  unodb::test::
  tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert<int>((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                 *)local_118,0xff0001,v_02,false);
  unodb::test::
  tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::assert_growing_inodes
            ((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              *)local_118,(inode_type_counter_array *)&stack0xfffffffffffffe88);
  unodb::test::
  tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::assert_key_prefix_splits
            ((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              *)local_118,1);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,1);
  local_188 = pvVar2->_M_ptr;
  sVar1 = (pvVar2->_M_extent)._M_extent_value;
  uStackY_180 = (undefined7)sVar1;
  v._M_extent._M_extent_value._7_1_ = (char)(sVar1 >> 0x38);
  v._0_15_ = *(undefined1 (*) [15])pvVar2;
  unodb::test::
  tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert<int>((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                 *)local_118,0xff0101,v,false);
  unodb::test::
  tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::check_present_values
            ((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              *)local_118);
  local_1a4[0] = 0xff0100;
  local_1a4[1] = 0xff0000;
  local_1a4[2] = 2;
  local_198 = local_1a4;
  local_190 = 3;
  absent_keys._M_len = 3;
  absent_keys._M_array = local_198;
  unodb::test::
  tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::check_absent_keys<int>
            ((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              *)local_118,absent_keys);
  local_1d8._M_elems[0] = 4;
  local_1d8._M_elems[1] = 3;
  local_1d8._M_elems[2] = 0;
  local_1d8._M_elems[3] = 0;
  local_1d8._M_elems[4] = 0;
  unodb::test::
  tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::assert_node_counts
            ((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              *)local_118,&local_1d8);
  memset(&local_1f8,0,0x20);
  local_1f8._M_elems[0] = 3;
  local_1f8._M_elems[1] = 0;
  local_1f8._M_elems[2] = 0;
  local_1f8._M_elems[3] = 0;
  unodb::test::
  tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::assert_growing_inodes
            ((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              *)local_118,&local_1f8);
  unodb::test::
  tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::assert_key_prefix_splits
            ((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              *)local_118,1);
  unodb::test::
  tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::~tree_verifier((tree_verifier<unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                    *)local_118);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTCorrectnessTest, DbInsertNodeRecursion) {
  unodb::test::tree_verifier<TypeParam> verifier;

  verifier.insert(1, unodb::test::test_values[0]);
  verifier.insert(3, unodb::test::test_values[2]);
  // Insert a value that does not share full prefix with the current Node4
  verifier.insert(0xFF0001, unodb::test::test_values[3]);

#ifdef UNODB_DETAIL_WITH_STATS
  verifier.assert_growing_inodes({2, 0, 0, 0});
  verifier.assert_key_prefix_splits(1);
#endif  // UNODB_DETAIL_WITH_STATS

  // Then insert a value that shares full prefix with the above node and will
  // ask for a recursive insertion there
  verifier.insert(0xFF0101, unodb::test::test_values[1]);

  verifier.check_present_values();
  verifier.check_absent_keys({0xFF0100, 0xFF0000, 2});

#ifdef UNODB_DETAIL_WITH_STATS
  verifier.assert_node_counts({4, 3, 0, 0, 0});
  verifier.assert_growing_inodes({3, 0, 0, 0});
  verifier.assert_key_prefix_splits(1);
#endif  // UNODB_DETAIL_WITH_STATS
}